

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.h
# Opt level: O3

void __thiscall
slang::ast::SolveBeforeConstraint::
visitExprs<always_ff_assignment_outside_conditional::MainVisitor&>
          (SolveBeforeConstraint *this,AlwaysFFVisitor *visitor)

{
  size_t sVar1;
  pointer ppEVar2;
  Expression *pEVar3;
  long lVar4;
  
  sVar1 = (this->solve)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (this->solve)._M_ptr;
    lVar4 = 0;
    do {
      pEVar3 = *(Expression **)((long)ppEVar2 + lVar4);
      Expression::
      visitExpression<slang::ast::Expression_const,always_ff_assignment_outside_conditional::MainVisitor&>
                (pEVar3,pEVar3,visitor);
      lVar4 = lVar4 + 8;
    } while (sVar1 << 3 != lVar4);
  }
  sVar1 = (this->after)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (this->after)._M_ptr;
    lVar4 = 0;
    do {
      pEVar3 = *(Expression **)((long)ppEVar2 + lVar4);
      Expression::
      visitExpression<slang::ast::Expression_const,always_ff_assignment_outside_conditional::MainVisitor&>
                (pEVar3,pEVar3,visitor);
      lVar4 = lVar4 + 8;
    } while (sVar1 << 3 != lVar4);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto item : solve)
            item->visit(visitor);
        for (auto item : after)
            item->visit(visitor);
    }